

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::smallestCommonMultiple(int a_,int b_)

{
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int i;
  int result;
  int b;
  int a;
  int b__local;
  int a__local;
  
  local_24 = b_;
  if (b_ < a_) {
    local_24 = a_;
  }
  result = local_24;
  local_28 = a_;
  if (b_ < a_) {
    local_28 = b_;
  }
  i = local_28;
  local_1c = 1;
  for (local_20 = local_28 / 2; 1 < local_20; local_20 = local_20 + -1) {
    for (; result % local_20 == 0 && i % local_20 == 0; result = result / local_20) {
      local_1c = local_20 * local_1c;
      i = i / local_20;
    }
  }
  return local_1c * result * i;
}

Assistant:

int smallestCommonMultiple (int a_, int b_)
{
	int	a		= (a_ > b_ ? a_ : b_);
	int	b		= (a_ > b_ ? b_ : a_);
	int	result  = 1;

	for (int i = b/2; i > 1; i--)
	{
		while ((a % i) == 0 && (b % i) == 0)
		{
			result *= i;
			a /= i;
			b /= i;
		}
	}

	return result * a * b;
}